

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Cluster::~Cluster(Cluster *this)

{
  BlockEntry **ppBVar1;
  long lVar2;
  BlockEntry *pBVar3;
  BlockEntry **ppBVar4;
  BlockEntry *p;
  BlockEntry **j;
  BlockEntry **i;
  Cluster *this_local;
  
  if (this->m_entries_count < 1) {
    if (this->m_entries != (BlockEntry **)0x0) {
      operator_delete__(this->m_entries);
    }
  }
  else {
    ppBVar1 = this->m_entries;
    lVar2 = this->m_entries_count;
    j = this->m_entries;
    while (j != ppBVar1 + lVar2) {
      ppBVar4 = j + 1;
      pBVar3 = *j;
      if (pBVar3 == (BlockEntry *)0x0) {
        __assert_fail("p",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1ab8,"mkvparser::Cluster::~Cluster()");
      }
      j = ppBVar4;
      if (pBVar3 != (BlockEntry *)0x0) {
        (*pBVar3->_vptr_BlockEntry[1])();
      }
    }
    if (this->m_entries != (BlockEntry **)0x0) {
      operator_delete__(this->m_entries);
    }
  }
  return;
}

Assistant:

Cluster::~Cluster() {
  if (m_entries_count <= 0) {
    delete[] m_entries;
    return;
  }

  BlockEntry** i = m_entries;
  BlockEntry** const j = m_entries + m_entries_count;

  while (i != j) {
    BlockEntry* p = *i++;
    assert(p);

    delete p;
  }

  delete[] m_entries;
}